

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O3

pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> * __thiscall
lattice::supercell::add_offset
          (pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          supercell *this,size_t index,offset_t *offset)

{
  long *plVar1;
  long lVar2;
  pointer puVar3;
  pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *ppVar4;
  plainobjectbase_evaluator_data<double,_0> pVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  ActualDstType actualDst;
  bool bVar10;
  long lVar11;
  Index othersize;
  size_t rows;
  ulong uVar12;
  offset_t cell;
  offset_t crossing;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>
  p;
  PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> local_98;
  DenseStorage<long,__1,__1,_1,_0> local_88;
  double local_78;
  pair<unsigned_long,_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *local_70;
  plainobjectbase_evaluator_data<double,_0> local_68;
  double *local_60;
  MatrixXd *local_50;
  MatrixXd *local_48;
  PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *local_40;
  
  uVar6 = (long)(this->index2lcord_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->index2lcord_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (index < uVar6) {
    lcord2offset((supercell *)&stack0xffffffffffffff98,(size_t)this);
    local_98.m_storage.m_data = (long *)0x0;
    local_98.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
              (&local_98,
               (offset->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows,1);
    pVar5.data = local_68.data;
    plVar1 = (offset->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    lVar9 = (offset->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (local_98.m_storage.m_rows != lVar9) {
      Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize(&local_98,lVar9,1);
      lVar9 = local_98.m_storage.m_rows;
    }
    if (0 < lVar9) {
      lVar8 = 0;
      do {
        local_98.m_storage.m_data[lVar8] = plVar1[lVar8] + (long)pVar5.data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
    }
    free(local_68.data);
    rows = this->dim_;
    local_88.m_data = (long *)0x0;
    local_88.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)&local_88,rows,1);
    if (local_88.m_rows != rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)&local_88,rows,1);
      rows = local_88.m_rows;
    }
    local_70 = __return_storage_ptr__;
    if (0 < (long)rows) {
      memset(local_88.m_data,0,rows << 3);
    }
    local_50 = &this->rs_;
    uVar6 = this->dim_;
    do {
      local_48 = local_50;
      if (uVar6 == 0) {
        uVar12 = 0;
        local_40 = &local_98;
        goto LAB_00104236;
      }
      bVar10 = true;
      lVar9 = 0;
      uVar12 = 0;
      local_40 = &local_98;
      do {
        Eigen::internal::
        product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             *)&stack0xffffffffffffff98,(XprType *)&stack0xffffffffffffffb8);
        local_78 = local_68.data[uVar12];
        free(local_60);
        if (-1e-08 <= local_78) {
          Eigen::internal::
          product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                               *)&stack0xffffffffffffff98,(XprType *)&stack0xffffffffffffffb8);
          local_78 = *(local_68.data + uVar12 * 8);
          free(local_60);
          if (0.99999999 < local_78) {
            lVar8 = 1;
            if (0 < local_98.m_storage.m_rows) {
              lVar2 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
              plVar1 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data;
              lVar11 = 0;
              do {
                local_98.m_storage.m_data[lVar11] =
                     local_98.m_storage.m_data[lVar11] -
                     *(long *)((long)plVar1 + lVar11 * 8 + lVar2 * lVar9);
                lVar11 = lVar11 + 1;
              } while (local_98.m_storage.m_rows != lVar11);
            }
            goto LAB_001041c1;
          }
        }
        else {
          lVar8 = -1;
          if (0 < local_98.m_storage.m_rows) {
            lVar2 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
            plVar1 = (this->span_).super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data;
            lVar11 = 0;
            do {
              local_98.m_storage.m_data[lVar11] =
                   local_98.m_storage.m_data[lVar11] +
                   *(long *)((long)plVar1 + lVar11 * 8 + lVar2 * lVar9);
              lVar11 = lVar11 + 1;
            } while (local_98.m_storage.m_rows != lVar11);
          }
LAB_001041c1:
          local_88.m_data[uVar12] = local_88.m_data[uVar12] + lVar8;
          bVar10 = false;
        }
        uVar12 = uVar12 + 1;
        uVar6 = this->dim_;
        lVar9 = lVar9 + 8;
      } while (uVar12 < uVar6);
    } while (!bVar10);
    if (uVar6 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      do {
        lVar2 = uVar6 - 1;
        lVar9 = (this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage
                .m_data[uVar6 - 1];
        lVar8 = uVar6 - 1;
        uVar6 = uVar6 - 1;
        uVar12 = (local_98.m_storage.m_data[lVar8] - lVar9) +
                 ((this->nmax_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[lVar2] - lVar9) * uVar12;
      } while (uVar6 != 0);
    }
LAB_00104236:
    ppVar4 = local_70;
    puVar3 = (this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar12 < (ulong)((long)(this->lcord2index_).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
      local_70->first = puVar3[uVar12];
      Eigen::DenseStorage<long,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<long,__1,__1,_1,_0> *)&local_70->second,&local_88);
      free(local_88.m_data);
      free(local_98.m_storage.m_data);
      return ppVar4;
    }
  }
  else {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",index,
               uVar6);
  }
  uVar7 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  free(local_88.m_data);
  free(local_98.m_storage.m_data);
  _Unwind_Resume(uVar7);
}

Assistant:

std::pair<std::size_t, offset_t> add_offset(std::size_t index, const offset_t& offset) const {
    offset_t cell = lcord2offset(index2lcord_.at(index)) + offset;
    offset_t crossing = offset_t::Zero(dim_);
    const double eps = 1.0e-8;
    bool checked = false;
    while (!checked) {
      checked = true;
      auto p = rs_ * cell.cast<double>();
      for (std::size_t m = 0; m < dim_; ++m) {
        if (p(m) < -eps) {
          checked = false;
          cell += span_.col(m);
          crossing(m) -= 1;
        } else if (p(m) > (1.0 - eps)) {
          checked = false;
          cell -= span_.col(m);
          crossing(m) += 1;
        }
      }
    }
    return std::make_pair(lcord2index(offset2lcord(cell)), crossing);
  }